

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_partial_union.cpp
# Opt level: O1

void __thiscall
PartialUnion_create_adjacency_lists_Test::TestBody(PartialUnion_create_adjacency_lists_Test *this)

{
  bool bVar1;
  int snapshots;
  long lVar2;
  int *piVar3;
  array<int,_8UL> *paVar4;
  iterator paVar5;
  char *pcVar6;
  byte bVar7;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  initializer_list<std::array<int,_8UL>_> __l_02;
  initializer_list<std::array<int,_8UL>_> __l_03;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_09;
  initializer_list<std::array<int,_8UL>_> __l_10;
  initializer_list<std::array<int,_8UL>_> __l_11;
  initializer_list<std::array<int,_8UL>_> __l_12;
  initializer_list<std::array<int,_8UL>_> __l_13;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_14;
  initializer_list<int> __l_15;
  initializer_list<int> __l_16;
  initializer_list<int> __l_17;
  initializer_list<int> __l_18;
  initializer_list<int> __l_19;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_20;
  initializer_list<std::array<int,_8UL>_> __l_21;
  initializer_list<std::array<int,_8UL>_> __l_22;
  initializer_list<std::array<int,_8UL>_> __l_23;
  initializer_list<std::array<int,_8UL>_> __l_24;
  initializer_list<std::array<int,_8UL>_> __l_25;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_26;
  initializer_list<int> __l_27;
  initializer_list<int> __l_28;
  initializer_list<int> __l_29;
  initializer_list<int> __l_30;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_31;
  initializer_list<std::array<int,_8UL>_> __l_32;
  initializer_list<std::array<int,_8UL>_> __l_33;
  initializer_list<std::array<int,_8UL>_> __l_34;
  initializer_list<std::array<int,_8UL>_> __l_35;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_36;
  initializer_list<int> __l_37;
  initializer_list<int> __l_38;
  initializer_list<int> __l_39;
  initializer_list<int> __l_40;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_41;
  initializer_list<std::array<int,_8UL>_> __l_42;
  initializer_list<std::array<int,_8UL>_> __l_43;
  initializer_list<std::array<int,_8UL>_> __l_44;
  initializer_list<std::array<int,_8UL>_> __l_45;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_46;
  FileReader fr;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  adjacency_lists;
  AssertionResult gtest_ar;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_05_ground_truth;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_05_ground_truth;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_04_ground_truth;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_04_ground_truth;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_03_ground_truth;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_03_ground_truth;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_02_ground_truth;
  string input_file;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> newedges;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_02_ground_truth;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_01_ground_truth;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_01_ground_truth;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  edges_set;
  set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  labeled_nodes;
  PartialUnion pu;
  allocator_type local_61e;
  allocator_type local_61d;
  allocator_type local_61c;
  allocator_type local_61b;
  allocator_type local_61a;
  FileReader local_619;
  array<int,_8UL> local_618;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> local_5b0;
  undefined1 local_598 [24];
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined1 local_538 [80];
  _Base_ptr local_4e8;
  _Base_ptr p_Stack_4e0;
  undefined1 local_4d8 [56];
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  _Stack_4a0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  _Stack_470;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  _Stack_440;
  int local_410;
  int iStack_40c;
  vector<int,_std::allocator<int>_> vStack_408;
  bool local_3f0;
  bool bStack_3ef;
  vector<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  vStack_3e8;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  local_3d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_3b8;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  local_3a0;
  undefined1 local_388 [16];
  pointer local_378;
  int aiStack_370 [4];
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  local_360;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_348;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  local_330;
  undefined1 *local_318;
  long local_310;
  undefined1 local_308 [16];
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_2f8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2e0;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  local_2c8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2b0;
  array<int,_8UL> local_298;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  array<int,_8UL> local_258;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  string local_218;
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  local_1f8;
  _Rb_tree<dgrminer::labeled_node_time,_dgrminer::labeled_node_time,_std::_Identity<dgrminer::labeled_node_time>,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  local_1c8;
  PartialUnion local_198;
  
  bVar7 = 0;
  dgrminer::PartialUnion::PartialUnion(&local_198);
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"data/intro_example","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_218,local_318,local_318 + local_310);
  dgrminer::FileReader::read_dynamic_graph_from_file
            ((PartialUnion *)local_538,&local_619,&local_218,10,false);
  local_198.value = local_538._0_4_;
  std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::operator=
            (&local_198.nodes,
             (vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_> *)(local_538 + 8)
            );
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator=
            (&local_198.edges,
             (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x20));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::operator=(&local_198.labelEncoding._M_t,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)(local_538 + 0x38));
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&local_198.encodingLabel._M_t,
              (_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_4d8 + 8));
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::operator=(&local_198.labelIsChange._M_t,&_Stack_4a0);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&local_198.antecedentLabelsOfLabels._M_t,&_Stack_470);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&local_198.dummyLabelsOfLabels._M_t,&_Stack_440);
  local_198.number_of_labels = local_410;
  local_198.number_of_dynamic_graphs = iStack_40c;
  std::vector<int,_std::allocator<int>_>::operator=(&local_198.mappingSnapshotsToGraphs,&vStack_408)
  ;
  local_198.new_measures = local_3f0;
  local_198.heuristic_mis = bStack_3ef;
  std::
  vector<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::operator=(&local_198.rawAdjacencyLists,&vStack_3e8);
  dgrminer::PartialUnion::~PartialUnion((PartialUnion *)local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  dgrminer::PartialUnion::compute_labeled_nodes
            ((set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
              *)&local_1c8,&local_198);
  snapshots = dgrminer::PartialUnion::getNumberOfSnapshots(&local_198);
  local_2f8.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f8._M_impl.super__Rb_tree_header._M_header;
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f8._M_impl.super__Rb_tree_header._M_header._M_left;
  dgrminer::PartialUnion::compute_labeled_edges
            (&local_198,&local_2f8,
             (set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)&local_1f8,
             (set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
              *)&local_1c8,false);
  dgrminer::PartialUnion::createAdjacencyLists(&local_5b0,&local_198,&local_2f8,snapshots);
  local_618._M_elems[0] = 1;
  __l._M_len = 1;
  __l._M_array = local_618._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_538,__l,(allocator_type *)&local_258);
  local_598._0_8_ = (ulong)(uint)local_598._4_4_ << 0x20;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_598;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_538 + 0x18),__l_00,
             (allocator_type *)&local_298);
  local_4e8 = (_Base_ptr)0x0;
  p_Stack_4e0 = (_Base_ptr)0x0;
  local_538._64_8_ = 0;
  local_538._72_8_ = (_Base_ptr)0x0;
  local_538._48_8_ = (pointer)0x0;
  local_538._56_8_ = 0;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)local_538;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_2b0,__l_01,(allocator_type *)local_388);
  lVar2 = 0x48;
  do {
    if (*(void **)(local_538 + lVar2) != (void *)0x0) {
      operator_delete(*(void **)(local_538 + lVar2));
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_618._M_elems[4] = 0;
  local_618._M_elems[5] = 4;
  local_618._M_elems[6] = 0;
  local_618._M_elems[7] = 1;
  local_618._M_elems[0] = 2;
  local_618._M_elems[1] = 0;
  local_618._M_elems[2] = 1;
  local_618._M_elems[3] = 6;
  __l_02._M_len = 1;
  __l_02._M_array = &local_618;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_538,
             __l_02,(allocator_type *)&local_258);
  local_598._16_4_ = 0;
  local_598._20_4_ = 2;
  uStack_580._0_4_ = 0;
  uStack_580._4_4_ = 1;
  local_598._0_8_ = (AssertHelperData *)0x4;
  local_598._8_4_ = 2;
  local_598._12_4_ = 6;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_598;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x18),__l_03,(allocator_type *)&local_298);
  local_4e8 = (_Base_ptr)0x0;
  p_Stack_4e0 = (_Base_ptr)0x0;
  local_538._64_8_ = 0;
  local_538._72_8_ = (_Base_ptr)0x0;
  local_538._48_8_ = (pointer)0x0;
  local_538._56_8_ = 0;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_538;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&local_2c8,__l_04,(allocator_type *)local_388);
  lVar2 = 0x48;
  do {
    if (*(void **)(local_538 + lVar2) != (void *)0x0) {
      operator_delete(*(void **)(local_538 + lVar2));
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_598._0_4_ = 1;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)local_598;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_538,__l_05,(allocator_type *)local_388);
  local_618._M_elems[0] = 0;
  local_618._M_elems[1] = 2;
  local_618._M_elems[2] = 3;
  __l_06._M_len = 3;
  __l_06._M_array = local_618._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_538 + 0x18),__l_06,
             (allocator_type *)&local_330);
  local_258._M_elems[0] = 1;
  __l_07._M_len = 1;
  __l_07._M_array = local_258._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_538 + 0x30),__l_07,
             (allocator_type *)&local_348);
  local_298._M_elems[0] = 1;
  __l_08._M_len = 1;
  __l_08._M_array = local_298._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_538 + 0x48),__l_08,
             (allocator_type *)&local_360);
  __l_09._M_len = 4;
  __l_09._M_array = (iterator)local_538;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_2e0,__l_09,(allocator_type *)&local_3a0);
  lVar2 = 0x48;
  do {
    if (*(void **)(local_538 + lVar2) != (void *)0x0) {
      operator_delete(*(void **)(local_538 + lVar2));
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_598._16_4_ = 1;
  local_598._20_4_ = 3;
  uStack_580._0_4_ = -1;
  uStack_580._4_4_ = 1;
  local_598._0_8_ = (AssertHelperData *)0x100000008;
  local_598._8_4_ = 1;
  local_598._12_4_ = 0xb;
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)local_598;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_538,
             __l_10,(allocator_type *)local_388);
  piVar3 = &DAT_001687b8;
  paVar4 = &local_618;
  for (lVar2 = 0x18; lVar2 != 0; lVar2 = lVar2 + -1) {
    paVar4->_M_elems[0] = *piVar3;
    piVar3 = piVar3 + (ulong)bVar7 * -2 + 1;
    paVar4 = (array<int,_8UL> *)((long)paVar4 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  __l_11._M_len = 3;
  __l_11._M_array = &local_618;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x18),__l_11,(allocator_type *)&local_348);
  local_258._M_elems[4] = 0;
  local_258._M_elems[5] = 3;
  local_258._M_elems[6] = -1;
  local_258._M_elems[7] = 2;
  local_258._M_elems[0] = 10;
  local_258._M_elems[1] = 1;
  local_258._M_elems[2] = 2;
  local_258._M_elems[3] = 6;
  __l_12._M_len = 1;
  __l_12._M_array = &local_258;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x30),__l_12,(allocator_type *)&local_360);
  local_298._M_elems[4] = 0;
  local_298._M_elems[5] = 3;
  local_298._M_elems[6] = -1;
  local_298._M_elems[7] = 3;
  local_298._M_elems[0] = 10;
  local_298._M_elems[1] = 1;
  local_298._M_elems[2] = 2;
  local_298._M_elems[3] = 6;
  __l_13._M_len = 1;
  __l_13._M_array = &local_298;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x48),__l_13,(allocator_type *)&local_3a0);
  __l_14._M_len = 4;
  __l_14._M_array = (iterator)local_538;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&local_330,__l_14,(allocator_type *)&local_3b8);
  lVar2 = 0x48;
  do {
    if (*(void **)(local_538 + lVar2) != (void *)0x0) {
      operator_delete(*(void **)(local_538 + lVar2));
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_618._M_elems[0] = 2;
  local_618._M_elems[1] = 3;
  local_618._M_elems[2] = 4;
  __l_15._M_len = 3;
  __l_15._M_array = local_618._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_538,__l_15,(allocator_type *)&local_360);
  local_598._0_8_ = (AssertHelperData *)0x300000002;
  __l_16._M_len = 2;
  __l_16._M_array = (iterator)local_598;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_538 + 0x18),__l_16,
             (allocator_type *)&local_3a0);
  local_258._M_elems[0] = 1;
  local_258._M_elems[1] = 0;
  __l_17._M_len = 2;
  __l_17._M_array = local_258._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_538 + 0x30),__l_17,
             (allocator_type *)&local_3b8);
  local_298._M_elems[0] = 1;
  local_298._M_elems[1] = 0;
  __l_18._M_len = 2;
  __l_18._M_array = local_298._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_538 + 0x48),__l_18,
             (allocator_type *)&local_3d0);
  local_388._0_8_ = (ulong)(uint)local_388._4_4_ << 0x20;
  __l_19._M_len = 1;
  __l_19._M_array = (iterator)local_388;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_4d8,__l_19,&local_61d);
  __l_20._M_len = 5;
  __l_20._M_array = (iterator)local_538;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_348,__l_20,&local_61e);
  lVar2 = 0x60;
  do {
    if (*(void **)(local_538 + lVar2) != (void *)0x0) {
      operator_delete(*(void **)(local_538 + lVar2));
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  piVar3 = &DAT_00168818;
  paVar4 = &local_618;
  for (lVar2 = 0x18; lVar2 != 0; lVar2 = lVar2 + -1) {
    paVar4->_M_elems[0] = *piVar3;
    piVar3 = piVar3 + (ulong)bVar7 * -2 + 1;
    paVar4 = (array<int,_8UL> *)((long)paVar4 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  __l_21._M_len = 3;
  __l_21._M_array = &local_618;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_538,
             __l_21,(allocator_type *)&local_3a0);
  local_568 = 0xd00000001;
  uStack_560 = 0x300000001;
  local_578 = 0xfffffffe00000003;
  uStack_570 = 0xb00000001;
  local_598._16_4_ = 1;
  local_598._20_4_ = 0xd;
  uStack_580 = &DAT_200000001;
  local_598._0_8_ = (AssertHelperData *)0xfffffffe00000003;
  local_598._8_4_ = 1;
  local_598._12_4_ = 0xb;
  __l_22._M_len = 2;
  __l_22._M_array = (iterator)local_598;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x18),__l_22,(allocator_type *)&local_3b8);
  local_228 = 0xc00000000;
  uStack_220 = 0x400000001;
  local_238 = 0x10000000d;
  uStack_230 = 0x600000001;
  local_258._M_elems[4] = 1;
  local_258._M_elems[5] = 3;
  local_258._M_elems[6] = -2;
  local_258._M_elems[7] = 2;
  local_258._M_elems[0] = 0xd;
  local_258._M_elems[1] = 1;
  local_258._M_elems[2] = 2;
  local_258._M_elems[3] = 0xb;
  __l_23._M_len = 2;
  __l_23._M_array = &local_258;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x30),__l_23,(allocator_type *)&local_3d0);
  local_268 = 0xc00000000;
  uStack_260 = 0x500000001;
  local_278 = 0x10000000d;
  uStack_270 = 0x600000001;
  local_298._M_elems[4] = 1;
  local_298._M_elems[5] = 3;
  local_298._M_elems[6] = -2;
  local_298._M_elems[7] = 3;
  local_298._M_elems[0] = 0xd;
  local_298._M_elems[1] = 1;
  local_298._M_elems[2] = 2;
  local_298._M_elems[3] = 0xb;
  __l_24._M_len = 2;
  __l_24._M_array = &local_298;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x48),__l_24,(allocator_type *)&local_61d);
  local_378 = (pointer)0xc00000000;
  aiStack_370[0] = 1;
  aiStack_370[1] = 6;
  local_388._0_8_ = (pointer)0x4;
  local_388._8_8_ = (pointer)0x600000002;
  __l_25._M_len = 1;
  __l_25._M_array = (iterator)local_388;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_4d8,
             __l_25,(allocator_type *)&local_61e);
  __l_26._M_len = 5;
  __l_26._M_array = (iterator)local_538;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&local_360,__l_26,&local_61c);
  lVar2 = 0x60;
  do {
    if (*(void **)(local_538 + lVar2) != (void *)0x0) {
      operator_delete(*(void **)(local_538 + lVar2));
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_618._M_elems[0] = 2;
  local_618._M_elems[1] = 3;
  local_618._M_elems[2] = 4;
  __l_27._M_len = 3;
  __l_27._M_array = local_618._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_538,__l_27,(allocator_type *)&local_3a0);
  local_538._24_8_ = (pointer)0x0;
  local_538._32_8_ = (pointer)0x0;
  local_538._40_8_ = (pointer)0x0;
  local_258._M_elems[0] = 0;
  local_258._M_elems[1] = 4;
  __l_28._M_len = 2;
  __l_28._M_array = local_258._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_538 + 0x30),__l_28,
             (allocator_type *)&local_3b8);
  local_298._M_elems[0] = 0;
  local_298._M_elems[1] = 4;
  __l_29._M_len = 2;
  __l_29._M_array = local_298._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_538 + 0x48),__l_29,
             (allocator_type *)&local_3d0);
  local_598._0_8_ = (AssertHelperData *)0x200000000;
  local_598._8_4_ = 3;
  __l_30._M_len = 3;
  __l_30._M_array = (iterator)local_598;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_4d8,__l_30,&local_61d);
  __l_31._M_len = 5;
  __l_31._M_array = (iterator)local_538;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_388,__l_31,&local_61e);
  lVar2 = 0x60;
  do {
    if (*(void **)(local_538 + lVar2) != (void *)0x0) {
      operator_delete(*(void **)(local_538 + lVar2));
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  piVar3 = &DAT_00168938;
  paVar4 = &local_618;
  for (lVar2 = 0x18; lVar2 != 0; lVar2 = lVar2 + -1) {
    paVar4->_M_elems[0] = *piVar3;
    piVar3 = piVar3 + (ulong)bVar7 * -2 + 1;
    paVar4 = (array<int,_8UL> *)((long)paVar4 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  __l_32._M_len = 3;
  __l_32._M_array = &local_618;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_538,
             __l_32,(allocator_type *)&local_3b8);
  local_538._24_8_ = (pointer)0x0;
  local_538._32_8_ = (pointer)0x0;
  local_538._40_8_ = (pointer)0x0;
  local_228 = 0x300000000;
  uStack_220 = 0x7ffffffff;
  local_238 = 0x10000000a;
  uStack_230 = 0x600000002;
  local_258._M_elems[4] = 1;
  local_258._M_elems[5] = 8;
  local_258._M_elems[6] = 1;
  local_258._M_elems[7] = 4;
  local_258._M_elems[0] = 10;
  local_258._M_elems[1] = 1;
  local_258._M_elems[2] = 1;
  local_258._M_elems[3] = 0xb;
  __l_33._M_len = 2;
  __l_33._M_array = &local_258;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x30),__l_33,(allocator_type *)&local_3d0);
  local_268 = 0x300000000;
  uStack_260 = 0x8ffffffff;
  local_278 = 0x10000000a;
  uStack_270 = 0x600000002;
  local_298._M_elems[4] = 1;
  local_298._M_elems[5] = 8;
  local_298._M_elems[6] = 1;
  local_298._M_elems[7] = 5;
  local_298._M_elems[0] = 10;
  local_298._M_elems[1] = 1;
  local_298._M_elems[2] = 1;
  local_298._M_elems[3] = 0xb;
  __l_34._M_len = 2;
  __l_34._M_array = &local_298;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x48),__l_34,(allocator_type *)&local_61d);
  piVar3 = &DAT_00168a18;
  paVar5 = (iterator)local_598;
  for (lVar2 = 0x18; lVar2 != 0; lVar2 = lVar2 + -1) {
    paVar5->_M_elems[0] = *piVar3;
    piVar3 = piVar3 + (ulong)bVar7 * -2 + 1;
    paVar5 = (iterator)((long)paVar5 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  __l_35._M_len = 3;
  __l_35._M_array = (iterator)local_598;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_4d8,
             __l_35,(allocator_type *)&local_61e);
  __l_36._M_len = 5;
  __l_36._M_array = (iterator)local_538;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&local_3a0,__l_36,&local_61c);
  lVar2 = 0x60;
  do {
    if (*(void **)(local_538 + lVar2) != (void *)0x0) {
      operator_delete(*(void **)(local_538 + lVar2));
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_618._M_elems[0] = 2;
  local_618._M_elems[1] = 3;
  __l_37._M_len = 2;
  __l_37._M_array = local_618._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_538,__l_37,(allocator_type *)&local_3d0);
  local_538._24_8_ = (pointer)0x0;
  local_538._32_8_ = (pointer)0x0;
  local_538._40_8_ = (pointer)0x0;
  local_598._0_8_ = (AssertHelperData *)0x4;
  __l_38._M_len = 2;
  __l_38._M_array = (iterator)local_598;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_538 + 0x30),__l_38,&local_61d);
  local_258._M_elems[0] = 4;
  local_258._M_elems[1] = 0;
  __l_39._M_len = 2;
  __l_39._M_array = local_258._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_538 + 0x48),__l_39,
             (allocator_type *)&local_61e);
  local_298._M_elems[0] = 2;
  local_298._M_elems[1] = 3;
  __l_40._M_len = 2;
  __l_40._M_array = local_298._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_4d8,__l_40,(allocator_type *)&local_61c);
  __l_41._M_len = 5;
  __l_41._M_array = (iterator)local_538;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_3b8,__l_41,&local_61b);
  lVar2 = 0x60;
  do {
    if (*(void **)(local_538 + lVar2) != (void *)0x0) {
      operator_delete(*(void **)(local_538 + lVar2));
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_5e8 = 0xd00000000;
  uStack_5e0 = 0xa00000001;
  local_5f8 = 0x10000000c;
  uStack_5f0 = 0x600000002;
  local_618._M_elems[4] = 0;
  local_618._M_elems[5] = 0xd;
  local_618._M_elems[6] = 1;
  local_618._M_elems[7] = 9;
  local_618._M_elems._0_8_ = (long *)0x10000000c;
  local_618._M_elems[2] = 2;
  local_618._M_elems[3] = 6;
  __l_42._M_len = 2;
  __l_42._M_array = &local_618;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_538,
             __l_42,(allocator_type *)&local_61d);
  local_538._24_8_ = (pointer)0x0;
  local_538._32_8_ = (pointer)0x0;
  local_538._40_8_ = (pointer)0x0;
  local_568 = 0xc00000000;
  uStack_560 = 0x900000001;
  local_578 = 0x10000000d;
  uStack_570 = 0x600000001;
  local_598._16_4_ = 1;
  local_598._20_4_ = 3;
  uStack_580._0_4_ = -2;
  uStack_580._4_4_ = 7;
  local_598._0_8_ = (AssertHelperData *)0x10000000d;
  local_598._8_4_ = 2;
  local_598._12_4_ = 0xb;
  __l_43._M_len = 2;
  __l_43._M_array = (iterator)local_598;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x30),__l_43,(allocator_type *)&local_61e);
  local_228 = 0xc00000000;
  uStack_220 = 0xa00000001;
  local_238 = 0x10000000d;
  uStack_230 = 0x600000001;
  local_258._M_elems[4] = 1;
  local_258._M_elems[5] = 3;
  local_258._M_elems[6] = -2;
  local_258._M_elems[7] = 8;
  local_258._M_elems[0] = 0xd;
  local_258._M_elems[1] = 1;
  local_258._M_elems[2] = 2;
  local_258._M_elems[3] = 0xb;
  __l_44._M_len = 2;
  __l_44._M_array = &local_258;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_538 + 0x48),__l_44,(allocator_type *)&local_61c);
  local_268 = 0xd00000001;
  uStack_260 = 0x800000001;
  local_278 = 0xfffffffe00000003;
  uStack_270 = 0xb00000001;
  local_298._M_elems[4] = 1;
  local_298._M_elems[5] = 0xd;
  local_298._M_elems[6] = 1;
  local_298._M_elems[7] = 7;
  local_298._M_elems[0] = 3;
  local_298._M_elems[1] = -2;
  local_298._M_elems[2] = 1;
  local_298._M_elems[3] = 0xb;
  __l_45._M_len = 2;
  __l_45._M_array = &local_298;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_4d8,
             __l_45,(allocator_type *)&local_61b);
  __l_46._M_len = 5;
  __l_46._M_array = (iterator)local_538;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&local_3d0,__l_46,&local_61a);
  lVar2 = 0x60;
  do {
    if (*(void **)(local_538 + lVar2) != (void *)0x0) {
      operator_delete(*(void **)(local_538 + lVar2));
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  testing::internal::
  CmpHelperEQ<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
            ((internal *)local_538,"adjacency_lists[0].adjacencyList",
             "adjacency_list_01_ground_truth",
             &(local_5b0.
               super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
               ._M_impl.super__Vector_impl_data._M_start)->adjacencyList,&local_2b0);
  if (local_538[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_618);
    if ((pointer)local_538._8_8_ == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)(int *)local_538._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_598,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
               ,0x6d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_598,(Message *)&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_598);
    if ((long *)local_618._M_elems._0_8_ != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_618._M_elems._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_618._M_elems._0_8_ + 8))();
      }
      local_618._M_elems._0_8_ = (long *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_538 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_538 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::
    CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
              ((internal *)local_538,"adjacency_lists[0].adjacencyEdgeInfo",
               "adjacency_info_01_ground_truth",
               &(local_5b0.
                 super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                 ._M_impl.super__Vector_impl_data._M_start)->adjacencyEdgeInfo,&local_2c8);
    if (local_538[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_618);
      if ((pointer)local_538._8_8_ == (pointer)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)(int *)local_538._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_598,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                 ,0x6e,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_598,(Message *)&local_618);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_598);
      if ((long *)local_618._M_elems._0_8_ != (long *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)local_618._M_elems._0_8_ != (long *)0x0)) {
          (**(code **)(*(long *)local_618._M_elems._0_8_ + 8))();
        }
        local_618._M_elems._0_8_ = (long *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_538 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_538 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::
      CmpHelperEQ<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                ((internal *)local_538,"adjacency_lists[1].adjacencyList",
                 "adjacency_list_02_ground_truth",
                 &local_5b0.
                  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].adjacencyList,&local_2e0);
      if (local_538[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_618);
        if ((pointer)local_538._8_8_ == (pointer)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)(int *)local_538._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_598,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                   ,0x6f,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_598,(Message *)&local_618);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_598);
        if ((long *)local_618._M_elems._0_8_ != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_618._M_elems._0_8_ != (long *)0x0)) {
            (**(code **)(*(long *)local_618._M_elems._0_8_ + 8))();
          }
          local_618._M_elems._0_8_ = (long *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_538 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_538 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::
        CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                  ((internal *)local_538,"adjacency_lists[1].adjacencyEdgeInfo",
                   "adjacency_info_02_ground_truth",
                   &local_5b0.
                    super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].adjacencyEdgeInfo,&local_330);
        if (local_538[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_618);
          if ((pointer)local_538._8_8_ == (pointer)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)(int *)local_538._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_598,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                     ,0x70,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_598,(Message *)&local_618);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_598);
          if ((long *)local_618._M_elems._0_8_ != (long *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && ((long *)local_618._M_elems._0_8_ != (long *)0x0)) {
              (**(code **)(*(long *)local_618._M_elems._0_8_ + 8))();
            }
            local_618._M_elems._0_8_ = (long *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_538 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_538 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          testing::internal::
          CmpHelperEQ<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                    ((internal *)local_538,"adjacency_lists[2].adjacencyList",
                     "adjacency_list_03_ground_truth",
                     &local_5b0.
                      super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].adjacencyList,&local_348);
          if (local_538[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_618);
            if ((pointer)local_538._8_8_ == (pointer)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)(int *)local_538._8_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_598,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                       ,0x71,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_598,(Message *)&local_618);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_598);
            if ((long *)local_618._M_elems._0_8_ != (long *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && ((long *)local_618._M_elems._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_618._M_elems._0_8_ + 8))();
              }
              local_618._M_elems._0_8_ = (long *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_538 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_538 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::
            CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                      ((internal *)local_538,"adjacency_lists[2].adjacencyEdgeInfo",
                       "adjacency_info_03_ground_truth",
                       &local_5b0.
                        super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].adjacencyEdgeInfo,&local_360);
            if (local_538[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_618);
              if ((pointer)local_538._8_8_ == (pointer)0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)(int *)local_538._8_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_598,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                         ,0x72,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_598,(Message *)&local_618);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_598);
              if ((long *)local_618._M_elems._0_8_ != (long *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && ((long *)local_618._M_elems._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_618._M_elems._0_8_ + 8))();
                }
                local_618._M_elems._0_8_ = (long *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_538 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_538 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::
              CmpHelperEQ<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                        ((internal *)local_538,"adjacency_lists[3].adjacencyList",
                         "adjacency_list_04_ground_truth",
                         &local_5b0.
                          super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].adjacencyList,
                         (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)local_388);
              if (local_538[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_618);
                if ((pointer)local_538._8_8_ == (pointer)0x0) {
                  pcVar6 = "";
                }
                else {
                  pcVar6 = *(char **)(int *)local_538._8_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_598,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                           ,0x73,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_598,(Message *)&local_618);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_598);
                if ((long *)local_618._M_elems._0_8_ != (long *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && ((long *)local_618._M_elems._0_8_ != (long *)0x0)) {
                    (**(code **)(*(long *)local_618._M_elems._0_8_ + 8))();
                  }
                  local_618._M_elems._0_8_ = (long *)0x0;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(local_538 + 8),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(local_538 + 8),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                testing::internal::
                CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                          ((internal *)local_538,"adjacency_lists[3].adjacencyEdgeInfo",
                           "adjacency_info_04_ground_truth",
                           &local_5b0.
                            super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                            ._M_impl.super__Vector_impl_data._M_start[3].adjacencyEdgeInfo,
                           &local_3a0);
                if (local_538[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_618);
                  if ((pointer)local_538._8_8_ == (pointer)0x0) {
                    pcVar6 = "";
                  }
                  else {
                    pcVar6 = *(char **)(int *)local_538._8_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_598,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                             ,0x74,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_598,(Message *)&local_618);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_598);
                  if ((long *)local_618._M_elems._0_8_ != (long *)0x0) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) && ((long *)local_618._M_elems._0_8_ != (long *)0x0)) {
                      (**(code **)(*(long *)local_618._M_elems._0_8_ + 8))();
                    }
                    local_618._M_elems._0_8_ = (long *)0x0;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(local_538 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(local_538 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::
                  CmpHelperEQ<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                            ((internal *)local_538,"adjacency_lists[4].adjacencyList",
                             "adjacency_list_05_ground_truth",
                             &local_5b0.
                              super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                              ._M_impl.super__Vector_impl_data._M_start[4].adjacencyList,&local_3b8)
                  ;
                  if (local_538[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_618);
                    if ((pointer)local_538._8_8_ == (pointer)0x0) {
                      pcVar6 = "";
                    }
                    else {
                      pcVar6 = *(char **)(int *)local_538._8_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)local_598,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                               ,0x75,pcVar6);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)local_598,(Message *)&local_618);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_598);
                    if ((long *)local_618._M_elems._0_8_ != (long *)0x0) {
                      bVar1 = testing::internal::IsTrue(true);
                      if ((bVar1) && ((long *)local_618._M_elems._0_8_ != (long *)0x0)) {
                        (**(code **)(*(long *)local_618._M_elems._0_8_ + 8))();
                      }
                      local_618._M_elems._0_8_ = (long *)0x0;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(local_538 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(local_538 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    testing::internal::
                    CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                              ((internal *)local_538,"adjacency_lists[4].adjacencyEdgeInfo",
                               "adjacency_info_05_ground_truth",
                               &local_5b0.
                                super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                                ._M_impl.super__Vector_impl_data._M_start[4].adjacencyEdgeInfo,
                               &local_3d0);
                    if (local_538[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_618);
                      if ((pointer)local_538._8_8_ == (pointer)0x0) {
                        pcVar6 = "";
                      }
                      else {
                        pcVar6 = *(char **)(int *)local_538._8_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)local_598,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                                 ,0x76,pcVar6);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)local_598,(Message *)&local_618);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_598);
                      if ((long *)local_618._M_elems._0_8_ != (long *)0x0) {
                        bVar1 = testing::internal::IsTrue(true);
                        if ((bVar1) && ((long *)local_618._M_elems._0_8_ != (long *)0x0)) {
                          (**(code **)(*(long *)local_618._M_elems._0_8_ + 8))();
                        }
                        local_618._M_elems._0_8_ = (long *)0x0;
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(local_538 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector(&local_3d0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_3b8);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector(&local_3a0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_388);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector(&local_360);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_348);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector(&local_330);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_2e0);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector(&local_2c8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_2b0);
  std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::~vector
            (&local_5b0);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree(&local_1f8);
  if (local_2f8.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<dgrminer::labeled_node_time,_dgrminer::labeled_node_time,_std::_Identity<dgrminer::labeled_node_time>,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  ::~_Rb_tree(&local_1c8);
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  dgrminer::PartialUnion::~PartialUnion(&local_198);
  return;
}

Assistant:

TEST(PartialUnion, create_adjacency_lists) {
    // assumes working file reader

    FileReader fr;
    PartialUnion pu;
    bool search_for_anomalies = false;
    int window_size = 10;
    std::string input_file = "data/intro_example";

    pu = fr.read_dynamic_graph_from_file(input_file, window_size, search_for_anomalies);

    std::set<labeled_node_time> labeled_nodes = pu.compute_labeled_nodes();
    int snapshots = pu.getNumberOfSnapshots();
    std::vector<std::array<int, 8>> newedges;
    std::set<labeled_edge_with_occurrences> edges_set;
    pu.compute_labeled_edges(newedges, edges_set, labeled_nodes, false);
    std::vector<AdjacencyListCrate> adjacency_lists = pu.createAdjacencyLists(newedges, snapshots);

//    for (int i = 0; i < adjacency_lists.size(); ++i) {
//        println("LIST: ");
//        println(adjacency_lists[i].adjacencyList);
//        println(adjacency_lists[i].adjacencyEdgeInfo);
//    }
//
//    for (int j = 0; j < 14; ++j) {
//        println("LABEL: ", j, " ", pu.getEncodingLabel(j));
//    }

    std::vector<std::vector<int>> adjacency_list_01_ground_truth = {{1},
                                                                    {0},
                                                                    {},
                                                                    {}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_01_ground_truth = {
            {{2, 0, 1, 6, 0, 4, 0, 1}}, // added nodes with edges (all changetimes = 0)
            {{4, 0, 2, 6, 0, 2, 0, 1}},
            {},
            {}
    };
    std::vector<std::vector<int>> adjacency_list_02_ground_truth = {{1},
                                                                    {0, 2, 3},
                                                                    {1},
                                                                    {1}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_02_ground_truth = {
            {{8,  1,  1, 11, 1, 3, -1, 1}}, // label change of node with 0 (label 2->8, i.e. +C -> C=>D, changetime 1), label of 1 stays (4 -> 3, i.e. +A -> A, changetime - 1)
            {{3,  -1, 2, 11, 1, 8, 1,  1}, {3, -1, 1, 6, 0, 10, 1, 2}, {3, -1, 1, 6, 0, 10, 1, 3}},
            {{10, 1,  2, 6,  0, 3, -1, 2}},
            {{10, 1,  2, 6,  0, 3, -1, 3}}
    };
    std::vector<std::vector<int>> adjacency_list_03_ground_truth = {{2, 3, 4},
                                                                    {2, 3},
                                                                    {1, 0},
                                                                    {1, 0},
                                                                    {0}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_03_ground_truth = {
            {{12, 1,  2, 6,  0, 13, 1,  4}, {12, 1,  2, 6,  0, 13, 1, 5}, {12, 1, 1, 6, 0, 4, 0, 6}},
            {{3,  -2, 1, 11, 1, 13, 1,  2}, {3,  -2, 1, 11, 1, 13, 1, 3}},
            {{13, 1,  2, 11, 1, 3,  -2, 2}, {13, 1,  1, 6,  0, 12, 1, 4}},
            {{13, 1,  2, 11, 1, 3,  -2, 3}, {13, 1,  1, 6,  0, 12, 1, 5}},
            {{4,  0,  2, 6,  0, 12, 1,  6}}

    };
    std::vector<std::vector<int>> adjacency_list_04_ground_truth = {{2, 3, 4},
                                                                    {},
                                                                    {0, 4},
                                                                    {0, 4},
                                                                    {0, 2, 3}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_04_ground_truth = {
            {{8,  1,  2, 11, 1, 10, 1, 4}, {8,  1,  2, 11, 1, 10, 1,  5}, {8, 1,  1, 11, 1, 3,  -1, 6}},
            {},
            {{10, 1,  1, 11, 1, 8,  1, 4}, {10, 1,  2, 6,  0, 3,  -1, 7}},
            {{10, 1,  1, 11, 1, 8,  1, 5}, {10, 1,  2, 6,  0, 3,  -1, 8}},
            {{3,  -1, 2, 11, 1, 8,  1, 6}, {3,  -1, 1, 6,  0, 10, 1,  7}, {3, -1, 1, 6,  0, 10, 1,  8}}

    };
    std::vector<std::vector<int>> adjacency_list_05_ground_truth = {{2, 3},
                                                                    {},
                                                                    {4, 0},
                                                                    {4, 0},
                                                                    {2, 3}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_05_ground_truth = {
            {{12, 1,  2, 6,  0, 13, 1,  9}, {12, 1,  2, 6,  0, 13, 1, 10}},
            {},
            {{13, 1,  2, 11, 1, 3,  -2, 7}, {13, 1,  1, 6,  0, 12, 1, 9}},
            {{13, 1,  2, 11, 1, 3,  -2, 8}, {13, 1,  1, 6,  0, 12, 1, 10}},
            {{3,  -2, 1, 11, 1, 13, 1,  7}, {3,  -2, 1, 11, 1, 13, 1, 8}}
    };

    ASSERT_EQ(adjacency_lists[0].adjacencyList, adjacency_list_01_ground_truth);
    ASSERT_EQ(adjacency_lists[0].adjacencyEdgeInfo, adjacency_info_01_ground_truth);
    ASSERT_EQ(adjacency_lists[1].adjacencyList, adjacency_list_02_ground_truth);
    ASSERT_EQ(adjacency_lists[1].adjacencyEdgeInfo, adjacency_info_02_ground_truth);
    ASSERT_EQ(adjacency_lists[2].adjacencyList, adjacency_list_03_ground_truth);
    ASSERT_EQ(adjacency_lists[2].adjacencyEdgeInfo, adjacency_info_03_ground_truth);
    ASSERT_EQ(adjacency_lists[3].adjacencyList, adjacency_list_04_ground_truth);
    ASSERT_EQ(adjacency_lists[3].adjacencyEdgeInfo, adjacency_info_04_ground_truth);
    ASSERT_EQ(adjacency_lists[4].adjacencyList, adjacency_list_05_ground_truth);
    ASSERT_EQ(adjacency_lists[4].adjacencyEdgeInfo, adjacency_info_05_ground_truth);

}